

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  pointer ppPVar1;
  BVHNode *pBVar2;
  ulong uVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00266e68;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(&(this->super_Aggregate).primitives,_primitives);
  ppPVar1 = (this->super_Aggregate).primitives.
            super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Aggregate).primitives.
      super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppPVar1) {
    sVar4 = 0;
    local_78 = -INFINITY;
    local_80 = -INFINITY;
    local_98 = INFINITY;
    local_88 = INFINITY;
    local_90 = INFINITY;
    local_b0 = -INFINITY;
    local_a8 = -INFINITY;
    local_70 = -INFINITY;
    local_a0 = -INFINITY;
  }
  else {
    uVar3 = 0;
    dVar11 = INFINITY;
    dVar7 = -INFINITY;
    dVar8 = -INFINITY;
    dVar9 = -INFINITY;
    dVar10 = INFINITY;
    dVar12 = INFINITY;
    do {
      (**ppPVar1[uVar3]->_vptr_Primitive)(&local_68);
      local_90 = local_50;
      if (dVar10 <= local_50) {
        local_90 = dVar10;
      }
      local_98 = local_48;
      if (dVar12 <= local_48) {
        local_98 = dVar12;
      }
      uVar5 = SUB84(local_40,0);
      uVar6 = (undefined4)((ulong)local_40 >> 0x20);
      if (dVar11 <= local_40) {
        uVar5 = SUB84(dVar11,0);
        uVar6 = (undefined4)((ulong)dVar11 >> 0x20);
      }
      local_a0 = local_68;
      if (local_68 <= dVar7) {
        local_a0 = dVar7;
      }
      local_a8 = local_60;
      if (local_60 <= dVar9) {
        local_a8 = dVar9;
      }
      local_b0 = local_58;
      if (local_58 <= dVar8) {
        local_b0 = dVar8;
      }
      uVar3 = uVar3 + 1;
      ppPVar1 = (this->super_Aggregate).primitives.
                super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = (long)(this->super_Aggregate).primitives.
                    super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
      dVar11 = (double)CONCAT44(uVar6,uVar5);
      dVar7 = local_a0;
      dVar8 = local_b0;
      dVar9 = local_a8;
      dVar10 = local_90;
      dVar12 = local_98;
    } while (uVar3 < sVar4);
    local_80 = local_a0 - local_90;
    local_78 = local_a8 - local_98;
    local_88 = (double)CONCAT44(uVar6,uVar5);
    local_70 = local_b0 - (double)CONCAT44(uVar6,uVar5);
  }
  pBVar2 = (BVHNode *)operator_new(0x68);
  (pBVar2->bb).max.x = local_a0;
  (pBVar2->bb).max.y = local_a8;
  (pBVar2->bb).max.z = local_b0;
  (pBVar2->bb).min.x = local_90;
  (pBVar2->bb).min.y = local_98;
  (pBVar2->bb).min.z = local_88;
  (pBVar2->bb).extent.x = local_80;
  (pBVar2->bb).extent.y = local_78;
  (pBVar2->bb).extent.z = local_70;
  pBVar2->start = 0;
  pBVar2->range = sVar4;
  pBVar2->l = (BVHNode *)0x0;
  pBVar2->r = (BVHNode *)0x0;
  this->root = pBVar2;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
      size_t max_leaf_size) {

    this->primitives = _primitives;

    // TODO:
    // Construct a BVH from the given vector of primitives and maximum leaf
    // size configuration. The starter code build a BVH aggregate with a
    // single leaf node (which is also the root) that encloses all the
    // primitives.

    BBox bb;
    for (size_t i = 0; i < primitives.size(); ++i) {
      bb.expand(primitives[i]->get_bbox());
    }

    root = new BVHNode(bb, 0, primitives.size());

  }